

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void utf8_to_ascii_test(void)

{
  char *pcVar1;
  ostream *poVar2;
  byte *pbVar3;
  int in_R8D;
  string local_1c0 [32];
  string local_1a0;
  string local_180 [32];
  string local_160;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  string b;
  string local_f0;
  undefined1 local_d0 [8];
  string a;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  char *local_10;
  char *input;
  
  local_10 = anon_var_dwarf_49fa;
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_49fa);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
  QUtil::utf8_to_ascii(&local_30,&local_50,'?');
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,pcVar1,(allocator<char> *)(a.field_2._M_local_buf + 0xf));
  QUtil::utf8_to_ascii(&local_88,&local_a8,'*');
  poVar2 = std::operator<<(poVar2,(string *)&local_88);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(a.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,pcVar1,(allocator<char> *)(b.field_2._M_local_buf + 0xf));
  QUtil::utf8_to_win_ansi((string *)local_d0,&local_f0,'*');
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)(b.field_2._M_local_buf + 0xf));
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar1,&local_139);
  QUtil::utf8_to_mac_roman((string *)local_118,&local_138,'*');
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  poVar2 = std::operator<<((ostream *)&std::cout,"<");
  pbVar3 = (byte *)std::__cxx11::string::at((ulong)local_d0);
  QUtil::int_to_string_base_abi_cxx11_(&local_160,(QUtil *)(ulong)*pbVar3,0x10,2,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_160);
  poVar2 = std::operator<<(poVar2,">");
  std::__cxx11::string::substr((ulong)local_180,(ulong)local_d0);
  poVar2 = std::operator<<(poVar2,local_180);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"<");
  pbVar3 = (byte *)std::__cxx11::string::at((ulong)local_118);
  QUtil::int_to_string_base_abi_cxx11_(&local_1a0,(QUtil *)(ulong)*pbVar3,0x10,2,in_R8D);
  poVar2 = std::operator<<(poVar2,(string *)&local_1a0);
  poVar2 = std::operator<<(poVar2,">");
  std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_118);
  poVar2 = std::operator<<(poVar2,local_1c0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_d0);
  return;
}

Assistant:

void
utf8_to_ascii_test()
{
    char const* input = "\302\277Does \317\200 have fingers?";
    std::cout << input << std::endl
              << QUtil::utf8_to_ascii(input) << std::endl
              << QUtil::utf8_to_ascii(input, '*') << std::endl;
    std::string a = QUtil::utf8_to_win_ansi(input, '*');
    std::string b = QUtil::utf8_to_mac_roman(input, '*');
    std::cout << "<" << QUtil::int_to_string_base(static_cast<unsigned char>(a.at(0)), 16, 2) << ">"
              << a.substr(1) << std::endl
              << "<" << QUtil::int_to_string_base(static_cast<unsigned char>(b.at(0)), 16, 2) << ">"
              << b.substr(1) << std::endl;
}